

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O0

void __thiscall Rml::ElementScroll::ElementScroll(ElementScroll *this,Element *_element)

{
  Scrollbar *local_30;
  Element *_element_local;
  ElementScroll *this_local;
  
  local_30 = this->scrollbars;
  do {
    Scrollbar::Scrollbar(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (Scrollbar *)&this->corner);
  this->element = _element;
  this->corner = (Element *)0x0;
  return;
}

Assistant:

ElementScroll::ElementScroll(Element* _element)
{
	element = _element;
	corner = nullptr;
}